

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libsdf.cpp
# Opt level: O3

void sdf::RenderNormal(Affine3d *transformation,int rows,int cols,Vector4f *cam_params,int max_steps
                      ,float max_ray_length,float precision,
                      vector<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_> *primitives,
                      Mat *Normals)

{
  bool bVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined8 extraout_XMM0_Qb;
  double dVar9;
  undefined8 uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  Mat Nmap;
  ulong local_160;
  undefined1 local_148 [16];
  double local_138;
  undefined8 uStack_130;
  double local_128;
  undefined8 uStack_120;
  double local_118;
  undefined8 uStack_110;
  double local_108;
  double dStack_100;
  double local_f8;
  undefined8 uStack_f0;
  ulong local_e8;
  ulong local_e0;
  Vector4f *local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  undefined1 local_b8 [16];
  Vector3d local_a8;
  Mat local_90 [16];
  long local_80;
  long *local_48;
  
  local_118 = (double)CONCAT44(local_118._4_4_,precision);
  local_128 = (double)CONCAT44(local_128._4_4_,max_ray_length);
  local_d8 = cam_params;
  cv::Mat::Mat(local_90,rows,cols,0x15);
  local_148 = ZEXT816(0);
  local_138 = 1.0;
  if (0 < rows) {
    local_108 = (transformation->m_matrix).
                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
                [0xc] * 1.0 +
                (transformation->m_matrix).
                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
                [8] * 0.0 +
                (transformation->m_matrix).
                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
                [4] * 0.0 +
                (transformation->m_matrix).
                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
                [0] * 0.0;
    dStack_100 = (transformation->m_matrix).
                 super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
                 [0xd] * 1.0 +
                 (transformation->m_matrix).
                 super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
                 [9] * 0.0 +
                 (transformation->m_matrix).
                 super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
                 [5] * 0.0 +
                 (transformation->m_matrix).
                 super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
                 [1] * 0.0;
    local_f8 = (transformation->m_matrix).
               super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
               [10] * 0.0 +
               (transformation->m_matrix).
               super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
               [6] * 0.0 +
               (transformation->m_matrix).
               super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
               [2] * 0.0 +
               (transformation->m_matrix).
               super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
               [0xe] * 1.0;
    uStack_f0 = 0x3ff0000000000000;
    local_d0 = (double)local_128._0_4_;
    bVar1 = 0.4 < local_d0;
    dVar5 = (double)local_118._0_4_;
    local_e8 = (ulong)(uint)rows;
    local_e0 = (ulong)(uint)cols;
    local_160 = 0;
    do {
      if (0 < cols) {
        uVar4 = 0;
        do {
          dVar6 = (double)((float)(int)uVar4 -
                          (local_d8->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).
                          m_storage.m_data.array[2]) /
                  (double)(local_d8->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).
                          m_storage.m_data.array[0];
          dVar9 = (double)((float)(int)local_160 -
                          (local_d8->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).
                          m_storage.m_data.array[3]) /
                  (double)(local_d8->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).
                          m_storage.m_data.array[1];
          local_148._8_8_ = dVar9;
          local_148._0_8_ = dVar6;
          local_138 = 1.0;
          uStack_130 = 0x3ff0000000000000;
          auVar14._0_8_ =
               (dVar9 * (transformation->m_matrix).
                        super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                        m_data.array[4] +
                dVar6 * (transformation->m_matrix).
                        super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                        m_data.array[0] +
                (transformation->m_matrix).
                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
                [8] + (transformation->m_matrix).
                      super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                      array[0xc]) - local_108;
          auVar14._8_8_ =
               (dVar9 * (transformation->m_matrix).
                        super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                        m_data.array[5] +
                dVar6 * (transformation->m_matrix).
                        super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                        m_data.array[1] +
                (transformation->m_matrix).
                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
                [9] + (transformation->m_matrix).
                      super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                      array[0xd]) - dStack_100;
          dVar6 = (dVar9 * (transformation->m_matrix).
                           super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                           m_data.array[6] +
                   dVar6 * (transformation->m_matrix).
                           super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                           m_data.array[2] +
                   (transformation->m_matrix).
                   super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                   array[10] +
                  (transformation->m_matrix).
                  super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                  array[0xe]) - local_f8;
          auVar7._0_8_ = dVar6 * dVar6 +
                         auVar14._8_8_ * auVar14._8_8_ + auVar14._0_8_ * auVar14._0_8_;
          if (0.0 < auVar7._0_8_) {
            auVar7._8_8_ = 0;
            auVar7 = sqrtpd(auVar7,auVar7);
            auVar8._0_8_ = auVar7._0_8_;
            dVar6 = dVar6 / auVar8._0_8_;
            auVar8._8_8_ = auVar8._0_8_;
            auVar14 = divpd(auVar14,auVar8);
          }
          if (bVar1 && 0 < max_steps) {
            local_118 = 0.0;
            iVar3 = 1;
            auVar11 = ZEXT816(0x3ff0000000000000);
            dVar9 = 0.4;
            uVar10 = 0;
            uStack_120 = 0x3ff0000000000000;
            local_128 = dVar6;
            local_b8 = auVar14;
            do {
              local_c8 = auVar11._0_8_;
              local_148._8_8_ = dVar9 * local_b8._8_8_ + dStack_100;
              local_148._0_8_ = dVar9 * local_b8._0_8_ + local_108;
              local_138 = local_128 * dVar9 + local_f8;
              local_c0 = local_118;
              local_118 = dVar9;
              uStack_110 = uVar10;
              dVar6 = SDF((Vector3d *)local_148,primitives);
              if (dVar6 < dVar5) {
                dVar6 = ((local_118 - local_c0) * local_c8) / (local_c8 - (dVar6 - dVar5)) +
                        local_c0;
                local_a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array[0] = (double)local_b8._0_8_ * dVar6 + local_108;
                local_a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array[1] = (double)local_b8._8_8_ * dVar6 + dStack_100;
                local_a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array[2] = local_128 * dVar6 + local_f8;
                SDFGradient((Vector3d *)local_148,&local_a8,primitives);
                auVar12._0_8_ =
                     local_138 * local_138 +
                     local_148._8_8_ * local_148._8_8_ + local_148._0_8_ * local_148._0_8_;
                dVar6 = local_138;
                if (0.0 < auVar12._0_8_) {
                  auVar12._8_8_ = 0;
                  auVar7 = sqrtpd(auVar12,auVar12);
                  auVar13._0_8_ = auVar7._0_8_;
                  dVar6 = local_138 / auVar13._0_8_;
                  auVar13._8_8_ = auVar13._0_8_;
                  local_148 = divpd(local_148,auVar13);
                }
                lVar2 = *local_48 * local_160 + local_80;
                *(ulong *)(lVar2 + 4 + uVar4 * 0xc) =
                     CONCAT44((float)local_148._8_8_,(float)local_148._0_8_);
                *(float *)(lVar2 + uVar4 * 0xc) = (float)dVar6;
                goto LAB_00104db4;
              }
              if (max_steps <= iVar3) break;
              dVar9 = dVar6 + local_118;
              iVar3 = iVar3 + 1;
              auVar11._8_8_ = extraout_XMM0_Qb;
              auVar11._0_8_ = dVar6;
              uVar10 = extraout_XMM0_Qb;
            } while (dVar9 < local_d0);
          }
          lVar2 = *local_48 * local_160 + local_80;
          *(undefined8 *)(lVar2 + uVar4 * 0xc) = 0x7fc000007fc00000;
          *(undefined4 *)(lVar2 + 8 + uVar4 * 0xc) = 0x7fc00000;
LAB_00104db4:
          uVar4 = uVar4 + 1;
        } while (uVar4 != local_e0);
      }
      local_160 = local_160 + 1;
    } while (local_160 != local_e8);
  }
  cv::Mat::operator=(Normals,local_90);
  cv::Mat::~Mat(local_90);
  return;
}

Assistant:

void RenderNormal(
    const Eigen::Affine3d &transformation, 
    const int rows, 
    const int cols, 
    Eigen::Vector4f &cam_params, 
    const int max_steps, 
    const float max_ray_length, 
    const float precision, 
    std::vector<Primitive*> &primitives,
    cv::Mat &Normals)
  {
    
    cv::Mat Nmap(rows, cols, CV_32FC3);
    const Eigen::Vector3d camera = transformation * Eigen::Vector3d(0.0,0.0,0.0);
    const Eigen::Vector3d viewAxis = (transformation * Eigen::Vector3d(0.0,0.0,1.0+1e-12) - camera).normalized(); 
    
    //Rendering loop
   #pragma omp parallel for collapse(2)
    for(int u = 0; u < rows; ++u)
    {
      for(int v = 0; v < cols; ++v)
      {
        bool hit = false;

        Eigen::Vector3d p = transformation*makeRay(u, v, 1.0, cam_params(0), cam_params(1), cam_params(2), cam_params(3)) - camera;
        p.normalize();
              
        double scaling = 0.4;
        double scaling_prev=0;
        double D = 1.0;
        int steps=0;
        while(steps<max_steps && scaling < max_ray_length && !hit)
        { 

          double D_prev = D;
          D = SDF(camera + p*scaling, primitives);
          if(D < precision)
          {
            scaling = scaling_prev + (scaling-scaling_prev)*D_prev/(D_prev - (D - precision));

            hit = true;
            Eigen::Vector3d normal_vector = SDFGradient(camera + p*scaling,primitives);            
            normal_vector.normalize();

            Nmap.at<cv::Vec3f>(u,v)[1]=(normal_vector(0));
            Nmap.at<cv::Vec3f>(u,v)[2]=(normal_vector(1));
            Nmap.at<cv::Vec3f>(u,v)[0]=(normal_vector(2));

            break;
          }
          scaling_prev = scaling;
          scaling += D;  
          ++steps;        
        }//ray
        if(!hit)     
        {
          Nmap.at<cv::Vec3f>(u,v)[0]=std::numeric_limits<float>::quiet_NaN();
          Nmap.at<cv::Vec3f>(u,v)[1]=std::numeric_limits<float>::quiet_NaN();
          Nmap.at<cv::Vec3f>(u,v)[2]=std::numeric_limits<float>::quiet_NaN();
        
        }//no hit
      }//col
    }//row 

    Normals = Nmap;
    return;
  }